

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.cc
# Opt level: O2

Result __thiscall wabt::TypeChecker::CheckOpcode1(TypeChecker *this,Opcode opcode,Limits *limits)

{
  Result RVar1;
  Type TVar2;
  char *desc;
  Opcode local_24;
  
  TVar2 = Opcode::GetParamType1(&local_24);
  TVar2 = GetMemoryParam(TVar2,limits);
  desc = Opcode::GetName(&local_24);
  RVar1 = PopAndCheck1Type(this,TVar2,desc);
  TVar2 = Opcode::GetResultType(&local_24);
  PushType(this,TVar2);
  return (Result)RVar1.enum_;
}

Assistant:

Result TypeChecker::CheckOpcode1(Opcode opcode, const Limits* limits) {
  Result result = PopAndCheck1Type(
      GetMemoryParam(opcode.GetParamType1(), limits), opcode.GetName());
  PushType(opcode.GetResultType());
  return result;
}